

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP4Writer::DoPutSync
          (BP4Writer *this,Variable<unsigned_short> *variable,uint16_t *data)

{
  int iVar1;
  BPInfo *pBVar2;
  ScopedTimer __var2191;
  string local_90;
  string local_70;
  string local_50;
  
  if (DoPutSync(adios2::core::Variable<unsigned_short>&,unsigned_short_const*)::__var191 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoPutSync(adios2::core::Variable<unsigned_short>&,unsigned_short_const*)
                                 ::__var191);
    if (iVar1 != 0) {
      DoPutSync::__var191 = (void *)ps_timer_create_("BP4Writer::Put");
      __cxa_guard_release(&DoPutSync(adios2::core::Variable<unsigned_short>&,unsigned_short_const*)
                           ::__var191);
    }
  }
  __var2191.m_timer = DoPutSync::__var191;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Engine","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"BP4Writer","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"PutSync","");
  iVar1 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_50,&local_70,&local_90,&(variable->super_VariableBase).m_Name,0,iVar1,5,
              this->m_Verbosity,INFO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pBVar2 = Variable<unsigned_short>::SetBlockInfo
                     (variable,data,
                      *(size_t *)
                       ((this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0x1d8 +
                       (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base),1);
  PutSyncCommon<unsigned_short>(this,variable,pBVar2,true);
  pBVar2 = (variable->m_BlocksInfo).
           super__Vector_base<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  (variable->m_BlocksInfo).
  super__Vector_base<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
  Variable<unsigned_short>::BPInfo::~BPInfo(pBVar2);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2191);
  return;
}

Assistant:

void BP4Writer::InitParameters()
{
    m_BP4Serializer.Init(m_IO.m_Parameters, "in call to BP4::Open to write");
    m_BP4Serializer.ResizeBuffer(m_BP4Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP4::Open to write");
    m_WriteToBB = !(m_BP4Serializer.m_Parameters.BurstBufferPath.empty());
    m_DrainBB = m_WriteToBB && m_BP4Serializer.m_Parameters.BurstBufferDrain;
}